

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

zt_ptr_array * zt_cstr_cut(char *str,int delim,int keep_delim)

{
  int iVar1;
  zt_ptr_array *array;
  zt_ptr_array *__ptr;
  char *pcVar2;
  zt_ptr_array *array_00;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  zt_ptr_array *cuts;
  char *cut_tok;
  char *str_copy;
  zt_ptr_array_free_cb in_stack_ffffffffffffffd0;
  zt_ptr_array *pzVar3;
  void *in_stack_ffffffffffffffd8;
  
  array = zt_ptr_array_init(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (array != (zt_ptr_array *)0x0) {
    __ptr = (zt_ptr_array *)strdup(in_RDI);
    array_00 = __ptr;
    do {
      pcVar2 = strchr((char *)array_00,in_ESI);
      if ((pcVar2 == (char *)0x0) ||
         (array_00 = (zt_ptr_array *)(pcVar2 + 1), (char)array_00->size == '\0')) {
        free(__ptr);
        return array;
      }
      pzVar3 = array;
      strdup((char *)((long)array_00 - (long)(int)(uint)(in_EDX != 0)));
      iVar1 = zt_ptr_array_add(array,(void *)0x1072b5);
      array = pzVar3;
    } while (-1 < iVar1);
    zt_ptr_array_free(array_00,(int)((ulong)pzVar3 >> 0x20));
    free(__ptr);
  }
  return (zt_ptr_array *)0x0;
}

Assistant:

zt_ptr_array *
zt_cstr_cut(const char *str, const int delim, int keep_delim) {
    char         *str_copy;
    char         *cut_tok;
    zt_ptr_array *cuts;

    if ((cuts = zt_ptr_array_init(NULL, free)) == NULL) {
        return NULL;
    }

    cut_tok    = str_copy = strdup(str);
    keep_delim = keep_delim ? 1 : 0;

    while ((cut_tok = strchr(cut_tok, delim))) {
        cut_tok++;

        if (*cut_tok == '\0') {
            break;
        }

        if (zt_ptr_array_add(cuts, (void *)strdup((char *)(cut_tok - keep_delim))) < 0) {
            zt_ptr_array_free(cuts, 1);
            free(str_copy);
            return NULL;
        }
    }

    free(str_copy);
    return cuts;
}